

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

vector<Player_*,_std::allocator<Player_*>_> *
initPlayers(int numPlayers,Map *map,vector<char,_std::allocator<char>_> *playerRoles)

{
  Country *pCVar1;
  bool bVar2;
  result_type_conflict1 rVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this;
  size_type __n;
  Country *pCVar5;
  reference ppCVar6;
  reference ppvVar7;
  vector<Player_*,_std::allocator<Player_*>_> *pvVar8;
  Player *this_00;
  Hand *this_01;
  DiceRoller *this_02;
  ostream *poVar9;
  reference pvVar10;
  StatsObserver *this_03;
  PhaseObserver *this_04;
  random_device local_4ec8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_3b40;
  __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_> local_27b8;
  __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_> local_27b0;
  char local_27a1;
  Player *pPStack_27a0;
  char strat;
  Player *player;
  vector<Player_*,_std::allocator<Player_*>_> *pvStack_2790;
  int i_2;
  vector<Player_*,_std::allocator<Player_*>_> *players;
  Country *currCountry;
  unsigned_long i_1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13f0;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  local_68;
  __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
  local_60;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *local_58;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *randomizedCountries;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *countries;
  int i;
  undefined1 local_38 [8];
  vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  countriesPerPlayer;
  vector<char,_std::allocator<char>_> *playerRoles_local;
  Map *map_local;
  int numPlayers_local;
  
  countriesPerPlayer.
  super__Vector_base<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)playerRoles;
  std::
  vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ::vector((vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
            *)local_38);
  std::
  vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ::reserve((vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
             *)local_38,(long)numPlayers);
  for (countries._0_4_ = 0; (int)countries < numPlayers; countries._0_4_ = (int)countries + 1) {
    pvVar4 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
    (pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(pvVar4);
    randomizedCountries = pvVar4;
    this = Map::getMapCountries(map);
    __n = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(this);
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::reserve(pvVar4,__n);
    std::
    vector<std::vector<Map::Country*,std::allocator<Map::Country*>>*,std::allocator<std::vector<Map::Country*,std::allocator<Map::Country*>>*>>
    ::emplace_back<std::vector<Map::Country*,std::allocator<Map::Country*>>*&>
              ((vector<std::vector<Map::Country*,std::allocator<Map::Country*>>*,std::allocator<std::vector<Map::Country*,std::allocator<Map::Country*>>*>>
                *)local_38,&randomizedCountries);
  }
  local_58 = Map::getMapCountries(map);
  local_60._M_current =
       (Country **)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(local_58);
  local_68._M_current =
       (Country **)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(local_58);
  std::random_device::random_device((random_device *)&i_1);
  rVar3 = std::random_device::operator()((random_device *)&i_1);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13f0,(ulong)rVar3);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Map::Country**,std::vector<Map::Country*,std::allocator<Map::Country*>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_60,local_68,&local_13f0);
  std::random_device::~random_device((random_device *)&i_1);
  for (currCountry = (Country *)0x0; pCVar1 = currCountry,
      pCVar5 = (Country *)
               std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(local_58),
      pCVar1 < pCVar5; currCountry = (Country *)((long)&currCountry->cyID + 1)) {
    ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                        (local_58,(size_type)currCountry);
    players = (vector<Player_*,_std::allocator<Player_*>_> *)*ppCVar6;
    Map::Country::setPlayerOwnerID((Country *)players,(int)currCountry % numPlayers);
    ppvVar7 = std::
              vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
              ::operator[]((vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
                            *)local_38,(ulong)currCountry % (ulong)(long)numPlayers);
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
              (*ppvVar7,(value_type *)&players);
  }
  pvVar8 = (vector<Player_*,_std::allocator<Player_*>_> *)operator_new(0x18);
  (pvVar8->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar8->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar8->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Player_*,_std::allocator<Player_*>_>::vector(pvVar8);
  pvStack_2790 = pvVar8;
  std::vector<Player_*,_std::allocator<Player_*>_>::reserve(pvVar8,(long)numPlayers);
  for (player._4_4_ = 0; player._4_4_ < numPlayers; player._4_4_ = player._4_4_ + 1) {
    this_00 = (Player *)operator_new(0x38);
    ppvVar7 = std::
              vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
              ::operator[]((vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
                            *)local_38,(long)player._4_4_);
    pvVar4 = *ppvVar7;
    this_01 = (Hand *)operator_new(8);
    Hand::Hand(this_01);
    this_02 = (DiceRoller *)operator_new(0x10);
    DiceRoller::DiceRoller(this_02);
    Player::Player(this_00,pvVar4,this_01,this_02,player._4_4_);
    local_27a1 = '\0';
    pPStack_27a0 = this_00;
    bVar2 = std::vector<char,_std::allocator<char>_>::empty(playerRoles);
    if (bVar2) {
      poVar9 = std::operator<<((ostream *)&std::cout,"What strategy should player ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,player._4_4_);
      poVar9 = std::operator<<(poVar9," use? a) Human b) aggresive c) passive d) random e) cheater")
      ;
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::operator>>((istream *)&std::cin,&local_27a1);
    }
    else {
      pvVar10 = std::vector<char,_std::allocator<char>_>::at(playerRoles,(long)player._4_4_);
      local_27a1 = *pvVar10 + '\x01';
    }
    switch(local_27a1) {
    case 'a':
      Player::setPlayerStrategy(pPStack_27a0,HUMAN_PLAYER);
      break;
    case 'b':
      Player::setPlayerStrategy(pPStack_27a0,AGGRESSIVE_BOT);
      break;
    case 'c':
      Player::setPlayerStrategy(pPStack_27a0,BENEVOLENT_BOT);
      break;
    case 'd':
      Player::setPlayerStrategy(pPStack_27a0,RANDOM_BOT);
      break;
    case 'e':
      Player::setPlayerStrategy(pPStack_27a0,CHEATER_BOT);
      break;
    default:
      Player::setPlayerStrategy(pPStack_27a0,HUMAN_PLAYER);
    }
    this_03 = (StatsObserver *)operator_new(0x10);
    StatsObserver::StatsObserver(this_03,pPStack_27a0);
    this_04 = (PhaseObserver *)operator_new(0x10);
    PhaseObserver::PhaseObserver(this_04,pPStack_27a0);
    std::vector<Player_*,_std::allocator<Player_*>_>::push_back
              (pvStack_2790,&stack0xffffffffffffd860);
  }
  local_27b0._M_current =
       (Player **)std::vector<Player_*,_std::allocator<Player_*>_>::begin(pvStack_2790);
  local_27b8._M_current =
       (Player **)std::vector<Player_*,_std::allocator<Player_*>_>::end(pvStack_2790);
  std::random_device::random_device(&local_4ec8);
  rVar3 = std::random_device::operator()(&local_4ec8);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_3b40,(ulong)rVar3);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Player**,std::vector<Player*,std::allocator<Player*>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_27b0,local_27b8,&local_3b40);
  std::random_device::~random_device(&local_4ec8);
  pvVar8 = pvStack_2790;
  std::
  vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
  ::~vector((vector<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*,_std::allocator<std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_*>_>
             *)local_38);
  return pvVar8;
}

Assistant:

static vector<Player*>* initPlayers(int numPlayers, Map* map, vector<char> playerRoles = {}) {
    vector<vector<Map::Country*>*> countriesPerPlayer;
    countriesPerPlayer.reserve(numPlayers);
    //split up the countries by the number of players
    for (int i = 0; i < numPlayers; i++) {
        auto* countries = new vector<Map::Country*>();
        countries->reserve(map->getMapCountries()->size());
        countriesPerPlayer.emplace_back(countries);
    }
    //randomize map countries
    vector<Map::Country*>* randomizedCountries = map->getMapCountries();
    std::shuffle(randomizedCountries->begin(), randomizedCountries->end(), std::mt19937(std::random_device()()));
    for (unsigned long i = 0; i < randomizedCountries->size(); i++) {
        Map::Country* currCountry = randomizedCountries->at(i);
        currCountry->setPlayerOwnerID(int(i) % numPlayers);
        countriesPerPlayer[i % numPlayers]->push_back(currCountry);
    }

    auto* players = new vector<Player*>();
    players->reserve(numPlayers);
    //create the players with their respective list of countries created above
    for (int i = 0; i < numPlayers; i++) {
        auto* player = new Player(countriesPerPlayer[i], new Hand(), new DiceRoller(), i);

        char strat = 0;

        //support tournament role
        if (playerRoles.empty()) {
            std::cout << "What strategy should player " << i
                      << " use? a) Human b) aggresive c) passive d) random e) cheater" << std::endl;
            std::cin >> strat;
        } else {
            //increment to match with switch case bellow
            strat = playerRoles.at(i);
            strat++;
        }

        switch (strat) {
            case 'a':
                player->setPlayerStrategy(Strategies::HUMAN_PLAYER);
                break;
            case 'b':
                player->setPlayerStrategy(Strategies::AGGRESSIVE_BOT);
                break;
            case 'c':
                player->setPlayerStrategy(Strategies::BENEVOLENT_BOT);
                break;
            case 'd':
                player->setPlayerStrategy(Strategies::RANDOM_BOT);
                break;
            case 'e':
                player->setPlayerStrategy(Strategies::CHEATER_BOT);
                break;
            default: {
                player->setPlayerStrategy(Strategies::HUMAN_PLAYER);
                break;
            }
        }
        new StatsObserver(player);
        new PhaseObserver(player);
        players->push_back(player);
    }
    std::shuffle(players->begin(), players->end(), std::mt19937(std::random_device()()));
    return players;
}